

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O1

tommy_trie_node * tommy_trie_bucket(tommy_trie *trie,tommy_key_t key)

{
  byte bVar1;
  tommy_trie_node *ptVar2;
  byte bVar3;
  tommy_trie_node *ptVar4;
  long in_FS_OFFSET;
  
  ptVar4 = trie->bucket[key >> 0x1b];
  if (ptVar4 == (tommy_trie_node *)0x0) {
    ptVar2 = (tommy_trie_node *)0x0;
  }
  else {
    bVar3 = 0x1b;
    ptVar2 = (tommy_trie_node *)0x0;
    do {
      if (((ulong)ptVar4 & 1) == 0) {
        ptVar2 = (tommy_trie_node *)0x0;
        if (ptVar4->key == key) {
          ptVar2 = ptVar4;
        }
        break;
      }
      bVar1 = bVar3 & 0x1f;
      bVar3 = bVar3 - 3;
      ptVar4 = *(tommy_trie_node **)((long)ptVar4 + (ulong)(key >> bVar1 & 7) * 8 + -1);
    } while (ptVar4 != (tommy_trie_node *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return ptVar2;
}

Assistant:

tommy_trie_node* tommy_trie_bucket(tommy_trie* trie, tommy_key_t key)
{
	tommy_trie_node* node;
	void* ptr;
	tommy_uint_t type;
	tommy_uint_t shift;

	ptr = trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	shift = TOMMY_TRIE_BUCKET_SHIFT;

recurse:
	if (!ptr)
		return 0;

	type = trie_get_type(ptr);

	switch (type) {
	case TOMMY_TRIE_TYPE_NODE :
		node = tommy_cast(tommy_trie_node*, ptr);
		if (node->key != key)
			return 0;
		return node;
	default :
	case TOMMY_TRIE_TYPE_TREE :
		ptr = trie_get_tree(ptr)->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;
		goto recurse;
	}
}